

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

Dar_Lib_t * Dar_LibRead(void)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *vOuts_00;
  Vec_Int_t *vPrios_00;
  Dar_Lib_t *p_01;
  int local_2c;
  int i;
  Dar_Lib_t *p;
  Vec_Int_t *vPrios;
  Vec_Int_t *vOuts;
  Vec_Int_t *vObjs;
  
  p_00 = Dar_LibReadNodes();
  vOuts_00 = Dar_LibReadOuts();
  vPrios_00 = Dar_LibReadPrios();
  iVar1 = Vec_IntSize(p_00);
  p_01 = Dar_LibAlloc(iVar1 / 2 + 4);
  for (local_2c = 0; local_2c < p_00->nSize; local_2c = local_2c + 2) {
    Dar_LibAddNode(p_01,p_00->pArray[local_2c] >> 1,p_00->pArray[local_2c + 1] >> 1,
                   p_00->pArray[local_2c] & 1,p_00->pArray[local_2c + 1] & 1);
  }
  Dar_LibSetup(p_01,vOuts_00,vPrios_00);
  Vec_IntFree(p_00);
  Vec_IntFree(vOuts_00);
  Vec_IntFree(vPrios_00);
  return p_01;
}

Assistant:

Dar_Lib_t * Dar_LibRead()
{
    Vec_Int_t * vObjs, * vOuts, * vPrios;
    Dar_Lib_t * p;
    int i;
    // read nodes and outputs
    vObjs  = Dar_LibReadNodes();
    vOuts  = Dar_LibReadOuts();
    vPrios = Dar_LibReadPrios();
    // create library
    p = Dar_LibAlloc( Vec_IntSize(vObjs)/2 + 4 );
    // create nodes
    for ( i = 0; i < vObjs->nSize; i += 2 )
        Dar_LibAddNode( p, vObjs->pArray[i] >> 1, vObjs->pArray[i+1] >> 1,
            vObjs->pArray[i] & 1, vObjs->pArray[i+1] & 1 );
    // create outputs
    Dar_LibSetup( p, vOuts, vPrios );
    Vec_IntFree( vObjs );
    Vec_IntFree( vOuts );
    Vec_IntFree( vPrios );
    return p;
}